

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O2

Enum __thiscall
ViconDataStreamSDK::Core::VClient::GetLatencySampleName
          (VClient *this,uint i_SampleIndex,string *o_rSampleName)

{
  bool bVar1;
  Enum EVar2;
  Enum GetResult;
  scoped_lock Lock;
  
  boost::unique_lock<boost::recursive_mutex>::unique_lock(&Lock,&this->m_FrameMutex);
  GetResult = Success;
  bVar1 = InitGet<std::__cxx11::string>(this,&GetResult,o_rSampleName);
  EVar2 = GetResult;
  if (bVar1) {
    if ((ulong)i_SampleIndex <
        (ulong)(((long)(this->m_LatestFrame).m_Latency.m_Samples.
                       super__Vector_base<ViconCGStreamDetail::VLatencyInfo_Sample,_std::allocator<ViconCGStreamDetail::VLatencyInfo_Sample>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->m_LatestFrame).m_Latency.m_Samples.
                      super__Vector_base<ViconCGStreamDetail::VLatencyInfo_Sample,_std::allocator<ViconCGStreamDetail::VLatencyInfo_Sample>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x28)) {
      std::__cxx11::string::_M_assign((string *)o_rSampleName);
      EVar2 = Success;
    }
    else {
      EVar2 = InvalidIndex;
    }
  }
  boost::unique_lock<boost::recursive_mutex>::~unique_lock(&Lock);
  return EVar2;
}

Assistant:

Result::Enum VClient::GetLatencySampleName( const unsigned int i_SampleIndex, std::string & o_rSampleName ) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );
  
  Result::Enum GetResult = Result::Success;
  if ( !InitGet( GetResult, o_rSampleName ) )
  {
    return GetResult; 
  }

  if( i_SampleIndex >= m_LatestFrame.m_Latency.m_Samples.size() )
  {
    return Result::InvalidIndex;
  }

  o_rSampleName = m_LatestFrame.m_Latency.m_Samples[ i_SampleIndex ].m_Name;

  return Result::Success;
}